

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxautopr.hpp
# Opt level: O0

bool __thiscall soplex::SPxAutoPR<double>::setActivePricer(SPxAutoPR<double> *this,Type type)

{
  int iVar1;
  undefined4 in_ESI;
  long in_RDI;
  
  if ((*(long *)(in_RDI + 0x40) == in_RDI + 0x48) &&
     (iVar1 = SPxSolverBase<double>::iterations((SPxSolverBase<double> *)0x2a6862),
     *(int *)(in_RDI + 0x38) <= iVar1)) {
    *(long *)(in_RDI + 0x40) = in_RDI + 0x100;
    (**(code **)(**(long **)(in_RDI + 0x40) + 0x38))(*(long **)(in_RDI + 0x40),in_ESI);
    return true;
  }
  if ((*(long *)(in_RDI + 0x40) == in_RDI + 0x100) &&
     (iVar1 = SPxSolverBase<double>::iterations((SPxSolverBase<double> *)0x2a68b7),
     iVar1 < *(int *)(in_RDI + 0x38))) {
    *(long *)(in_RDI + 0x40) = in_RDI + 0x48;
    (**(code **)(**(long **)(in_RDI + 0x40) + 0x38))(*(long **)(in_RDI + 0x40),in_ESI);
    return true;
  }
  return false;
}

Assistant:

bool SPxAutoPR<R>::setActivePricer(typename SPxSolverBase<R>::Type type)
{
   // switch to steep as soon as switchIters is reached
   if(activepricer == &devex && this->thesolver->iterations() >= switchIters)
   {
      activepricer = &steep;
      activepricer->setType(type);
      return true;
   }


   // use devex for the iterations < switchIters
   else if(activepricer == &steep && this->thesolver->iterations() < switchIters)
   {
      activepricer = &devex;
      activepricer->setType(type);
      return true;
   }

   return false;
}